

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::StructurePatternMemberSyntax::isKind(SyntaxKind kind)

{
  bool local_9;
  SyntaxKind kind_local;
  
  if ((kind == NamedStructurePatternMember) || (kind == OrderedStructurePatternMember)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool StructurePatternMemberSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::NamedStructurePatternMember:
        case SyntaxKind::OrderedStructurePatternMember:
            return true;
        default:
            return false;
    }
}